

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_send_recv.c
# Opt level: O1

int kvT_send_recv(int rank,int ranks)

{
  int iVar1;
  undefined8 uVar2;
  uint uVar3;
  char *pcVar4;
  kvtree *send;
  int val_of_three;
  int val_of_two;
  int val_of_one;
  kvtree *recv;
  long local_38;
  int local_2c;
  int local_28;
  int local_24;
  long local_20;
  
  local_38 = kvtree_new();
  local_20 = kvtree_new();
  if (rank == 0) {
    pcVar4 = "ONE";
    uVar2 = 1;
  }
  else if (rank == 1) {
    pcVar4 = "TWO";
    uVar2 = 2;
  }
  else {
    pcVar4 = "THREE";
    uVar2 = 3;
  }
  kvtree_util_set_int(local_38,pcVar4,uVar2);
  iVar1 = kvtree_sendrecv(local_38,(long)(rank + 1) % (long)ranks & 0xffffffff,local_20,
                          (long)(rank + ranks + -1) % (long)ranks & 0xffffffff,&ompi_mpi_comm_world)
  ;
  if (iVar1 != 0) {
    uVar3 = 0xa0;
    pcVar4 = "test_kvtree_send_recv, kvtree_sendrecv call failed";
    goto LAB_00101640;
  }
  if (rank == 0) {
    iVar1 = kvtree_util_get_int(local_38,"ONE",&local_24);
    if (iVar1 != 0) {
      uVar3 = 0xa7;
      pcVar4 = "test_kvtree_send_recv, in rank 0 could not read send value of \'ONE\'";
      goto LAB_00101640;
    }
    if (local_24 == 1) {
      iVar1 = kvtree_util_get_int(local_20,"THREE",&local_2c);
      if (iVar1 != 0) {
        uVar3 = 0xb2;
        pcVar4 = "test_kvtree_send_recv, in rank 0 could not read recv value of \'THREE\'";
        goto LAB_00101640;
      }
      if (local_2c == 3) goto LAB_00101679;
      uVar3 = 0xb7;
LAB_00101891:
      pcVar4 = "test_kvtree_send_recv, in rank 0 recv value is not correct";
      goto LAB_00101640;
    }
    uVar3 = 0xac;
LAB_0010174c:
    pcVar4 = "test_kvtree_send_recv, in rank 0 send value is not correct";
  }
  else {
LAB_00101679:
    if (rank == 2) {
      iVar1 = kvtree_util_get_int(local_38,"THREE",&local_2c);
      if (iVar1 != 0) {
        uVar3 = 0xd7;
        pcVar4 = "test_kvtree_send_recv, in rank 2 could not read send value of \'THREE\'";
        goto LAB_00101640;
      }
      if (local_2c != 3) {
        uVar3 = 0xdc;
        pcVar4 = "test_kvtree_send_recv, in rank 2 send value is not correct";
        goto LAB_00101640;
      }
      iVar1 = kvtree_util_get_int(local_20,"TWO",&local_28);
      if (iVar1 != 0) {
        uVar3 = 0xe2;
        pcVar4 = "test_kvtree_send_recv, in rank 2 could not read recv value of \'TWO\'";
        goto LAB_00101640;
      }
      if (local_28 != 2) {
        uVar3 = 0xe7;
        goto LAB_00101891;
      }
    }
    else if (rank == 1) {
      iVar1 = kvtree_util_get_int(local_38,"TWO",&local_28);
      if (iVar1 != 0) {
        uVar3 = 0xbf;
        pcVar4 = "test_kvtree_send_recv, in rank 1 could not read send value of \'TWO\'";
        goto LAB_00101640;
      }
      if (local_28 != 2) {
        uVar3 = 0xc4;
        goto LAB_0010174c;
      }
      iVar1 = kvtree_util_get_int(local_20,"ONE",&local_24);
      if (iVar1 != 0) {
        uVar3 = 0xca;
        pcVar4 = "test_kvtree_send_recv, in rank 0 could not read recv value of \'ONE\'";
        goto LAB_00101640;
      }
      if (local_24 != 1) {
        uVar3 = 0xcf;
        goto LAB_00101891;
      }
    }
    printf("rank = %d\n",(ulong)(uint)rank);
    puts("SEND HASH");
    kvtree_print(local_38,4);
    puts("RECEIVE HASH");
    kvtree_print(local_20,4);
    kvtree_delete(&local_38);
    if (local_38 == 0) {
      kvtree_delete(&local_20);
      if (local_20 == 0) {
        return 0;
      }
      uVar3 = 0xfc;
      pcVar4 = "test_kvtree_send_recv, deletion of recv failed";
    }
    else {
      uVar3 = 0xf6;
      pcVar4 = "test_kvtree_send_recv, deletion of kvtree failed";
    }
  }
LAB_00101640:
  printf(pcVar4);
  printf("Error in line %d, file %s, function %s.\n",(ulong)uVar3,
         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_send_recv.c"
         ,"kvT_send_recv");
  return 1;
}

Assistant:

int kvT_send_recv(int rank, int ranks){
  int kvtree_rc;
  int val_of_one, val_of_two, val_of_three;
  kvtree* send = kvtree_new();
  kvtree* recv = kvtree_new();
  if(rank == 0)
    kvtree_util_set_int(send, "ONE", 1);
  else if(rank == 1) 
    kvtree_util_set_int(send, "TWO", 2);
  else
    kvtree_util_set_int(send, "THREE", 3);
// with ranks in a circular queue, send to 1 rank forward, receive from 1 rank back
  kvtree_rc = kvtree_sendrecv(send, (rank+1) % ranks, recv, (rank-1+ranks) % ranks, MPI_COMM_WORLD);
  if(kvtree_rc != TEST_PASS){
    printf("test_kvtree_send_recv, kvtree_sendrecv call failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  if(rank == 0){
    kvtree_rc = kvtree_util_get_int(send, "ONE", &val_of_one);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 0 could not read send value of 'ONE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if (val_of_one != 1){
      printf("test_kvtree_send_recv, in rank 0 send value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "THREE", &val_of_three);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 0 could not read recv value of 'THREE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if (val_of_three != 3){
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
  }
  if(rank == 1){
    kvtree_rc = kvtree_util_get_int(send, "TWO", &val_of_two);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 1 could not read send value of 'TWO'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_two != 2){
      printf("test_kvtree_send_recv, in rank 0 send value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "ONE", &val_of_one);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 0 could not read recv value of 'ONE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_one != 1){
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
  }
  if(rank == 2){
    kvtree_rc = kvtree_util_get_int(send, "THREE", &val_of_three);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 2 could not read send value of 'THREE'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_three != 3){
      printf("test_kvtree_send_recv, in rank 2 send value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "TWO", &val_of_two);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_send_recv, in rank 2 could not read recv value of 'TWO'");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
    if (val_of_two != 2){
      printf("test_kvtree_send_recv, in rank 0 recv value is not correct");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
       return TEST_FAIL;
    }
  }

  printf("rank = %d\n", rank);
  printf("SEND HASH\n");
  kvtree_print(send, 4);
  printf("RECEIVE HASH\n");
  kvtree_print(recv, 4);
 
  
  kvtree_delete(&send);
  if (send != NULL){
    printf("test_kvtree_send_recv, deletion of kvtree failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
     return TEST_FAIL;
  }
  kvtree_delete(&recv);
  if (recv != NULL){
    printf("test_kvtree_send_recv, deletion of recv failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
     return TEST_FAIL;
  }

  return TEST_PASS;
}